

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

void __thiscall
amrex::FABio_ascii::write_header(FABio_ascii *this,ostream *os,FArrayBox *f,int nvar)

{
  ostream *poVar1;
  ostream *in_RSI;
  int in_stack_000000ac;
  FArrayBox *in_stack_000000b0;
  ostream *in_stack_000000b8;
  FABio *in_stack_000000c0;
  
  poVar1 = std::operator<<(in_RSI,"FAB: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,"IEEE");
  std::operator<<(poVar1,'\n');
  FABio::write_header(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000ac);
  return;
}

Assistant:

void
FABio_ascii::write_header (std::ostream&    os,
                           const FArrayBox& f,
                           int              nvar) const
{
    os << "FAB: "
       << FABio::FAB_ASCII
       << ' '
       << 0
       << ' '
       << sys_name
       << '\n';
    FABio::write_header(os, f, nvar);
}